

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

FIRSTPASS_STATS * read_frame_stats(TWO_PASS *p,TWO_PASS_FRAME *p_frame,int offset)

{
  int offset_local;
  TWO_PASS_FRAME *p_frame_local;
  TWO_PASS *p_local;
  FIRSTPASS_STATS *local_8;
  
  if (((offset < 0) || (p_frame->stats_in + offset < p->stats_buf_ctx->stats_in_end)) &&
     ((-1 < offset || (p->stats_buf_ctx->stats_in_start <= p_frame->stats_in + offset)))) {
    local_8 = p_frame->stats_in + offset;
  }
  else {
    local_8 = (FIRSTPASS_STATS *)0x0;
  }
  return local_8;
}

Assistant:

static const FIRSTPASS_STATS *read_frame_stats(const TWO_PASS *p,
                                               const TWO_PASS_FRAME *p_frame,
                                               int offset) {
  if ((offset >= 0 &&
       p_frame->stats_in + offset >= p->stats_buf_ctx->stats_in_end) ||
      (offset < 0 &&
       p_frame->stats_in + offset < p->stats_buf_ctx->stats_in_start)) {
    return NULL;
  }

  return &p_frame->stats_in[offset];
}